

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printPostIdxImm8s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  MCOperand *op;
  int64_t iVar6;
  char *pcVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  
  op = MCInst_getOperand(MI,3);
  iVar6 = MCOperand_getImm(op);
  uVar4 = (uint)iVar6;
  uVar8 = (uVar4 & 0xff) * 4;
  pcVar7 = anon_var_dwarf_3ee467 + 0x11;
  if ((uVar4 >> 8 & 1) == 0) {
    pcVar7 = "-";
  }
  pcVar5 = ", #%s%u";
  if (9 < uVar8) {
    pcVar5 = ", #%s0x%x";
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar5 + 2,pcVar7,(ulong)uVar8);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar3 = (uVar4 & 0xff) * -4;
    if ((uVar4 >> 8 & 1) != 0) {
      uVar3 = uVar8;
    }
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) = uVar3;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printPostIdxImm8s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	int Imm = (int)MCOperand_getImm(MO);

	if (((Imm & 0xff) << 2) > HEX_THRESHOLD) {
		SStream_concat(O, "#%s0x%x", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	} else {
		SStream_concat(O, "#%s%u", ((Imm & 256) ? "" : "-"), ((Imm & 0xff) << 2));
	}

	if (MI->csh->detail) {
		int v = (Imm & 256) ? ((Imm & 0xff) << 2) : -((Imm & 0xff) << 2);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = v;
		MI->flat_insn->detail->arm.op_count++;
	}
}